

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int load_column(ParseData *lParse,int varNum,long fRow,long nRows,void *data,char *undef)

{
  int iVar1;
  long lVar2;
  void *__ptr;
  long in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int anynul;
  int status;
  uchar *bytes;
  char msg [80];
  char **bitStrs;
  long idx;
  long len;
  long row;
  long nbytes;
  long nelem;
  iteratorCol *var;
  void *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  LONGLONG in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff28;
  uint uVar3;
  LONGLONG in_stack_ffffffffffffff30;
  LONGLONG in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  fitsfile *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  long local_68;
  long local_60;
  long local_58;
  int local_4;
  
  uVar3 = 0;
  lVar2 = *(long *)(in_RDI + 0xa0) + (long)in_ESI * 0x110;
  if (*(int *)(in_RDI + 0xdc) == 0) {
    ffgpf((fitsfile *)(ulong)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
          in_stack_ffffffffffffff18,CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
          in_stack_ffffffffffffff08,&stack0xffffffffffffff2c,
          (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
          (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (DEBUG_PIXFILTER != 0) {
      printf("load_column: IMAGE_HDU fRow=%ld, nRows=%ld => %d\n",in_RDX,in_RCX,(ulong)uVar3);
    }
  }
  else {
    iVar1 = *(int *)(lVar2 + 0x54);
    if (iVar1 == 0xb) {
      __ptr = malloc(((*(long *)(lVar2 + 0x68) + 7) / 8) * in_RCX);
      ffgcvb(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
             ,(LONGLONG)__ptr,(uchar)(uVar3 >> 0x18),(uchar *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
      lVar2 = *(long *)(lVar2 + 0x68);
      for (local_58 = 0; local_58 < in_RCX; local_58 = local_58 + 1) {
        local_68 = local_58 * ((lVar2 + 7) / 8) + 1;
        for (local_60 = 0; local_60 < lVar2; local_60 = local_60 + 1) {
          if (((uint)*(byte *)((long)__ptr + local_68) & 1 << (7U - (char)(local_60 % 8) & 0x1f)) ==
              0) {
            *(undefined1 *)(*(long *)(in_R8 + local_58 * 8) + local_60) = 0x30;
          }
          else {
            *(undefined1 *)(*(long *)(in_R8 + local_58 * 8) + local_60) = 0x31;
          }
          if (local_60 % 8 == 7) {
            local_68 = local_68 + 1;
          }
        }
        *(undefined1 *)(*(long *)(in_R8 + local_58 * 8) + local_60) = 0;
      }
      if (__ptr == (void *)0x0) {
        printf("invalid free((char *)bytes) at %s:%d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
               ,0xa6e);
      }
      else {
        free(__ptr);
      }
    }
    else if (iVar1 == 0xe) {
      ffgcfl(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
             ,in_stack_ffffffffffffff30,(char *)(ulong)in_stack_ffffffffffffff28,
             (char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    }
    else if (iVar1 == 0x10) {
      ffgcfs(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
             ,in_stack_ffffffffffffff30,(char **)(ulong)in_stack_ffffffffffffff28,
             (char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    }
    else if (iVar1 == 0x29) {
      ffgcfj(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
             ,in_stack_ffffffffffffff30,(long *)(ulong)in_stack_ffffffffffffff28,
             (char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    }
    else if (iVar1 == 0x52) {
      ffgcfd((fitsfile *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             (ulong)in_stack_ffffffffffffff28,(double *)CONCAT44(0x52,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,in_stack_ffffffffffffff70);
    }
    else {
      snprintf(&stack0xffffffffffffff38,0x50,"load_column: unexpected datatype %d",
               (ulong)*(uint *)(lVar2 + 0x54));
      ffpmsg((char *)0x12e825);
    }
  }
  if (uVar3 == 0) {
    local_4 = 0;
  }
  else {
    *(uint *)(in_RDI + 0xe0) = uVar3;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int load_column( ParseData *lParse, int varNum, long fRow, long nRows,
                        void *data, char *undef )
{
   iteratorCol *var;
   long nelem,nbytes,row,len,idx;
   char **bitStrs, msg[80];
   unsigned char *bytes;
   int status = 0, anynul;

   var = lParse->colData+varNum;
   if (lParse->hdutype == IMAGE_HDU) {
    /* This test would need to be on a per varNum basis to support
     * cross HDU operations */
    fits_read_imgnull(var->fptr, var->datatype, fRow, nRows,
                data, undef, &anynul, &status);
    if (DEBUG_PIXFILTER)
        printf("load_column: IMAGE_HDU fRow=%ld, nRows=%ld => %d\n",
                        fRow, nRows, status);
  } else { 

   nelem = nRows * var->repeat;

   switch( var->datatype ) {
   case TBYTE:
      nbytes = ((var->repeat+7)/8) * nRows;
      bytes = (unsigned char *)malloc( nbytes * sizeof(char) );

      ffgcvb(var->fptr, var->colnum, fRow, 1L, nbytes,
             0, bytes, &anynul, &status);

      nelem = var->repeat;
      bitStrs = (char **)data;
      for( row=0; row<nRows; row++ ) {
         idx = (row)*( (nelem+7)/8 ) + 1;
         for(len=0; len<nelem; len++) {
            if( bytes[idx] & (1<<(7-len%8)) )
               bitStrs[row][len] = '1';
            else
               bitStrs[row][len] = '0';
            if( len%8==7 ) idx++;
         }
         bitStrs[row][len] = '\0';
      }

      FREE( (char *)bytes );
      break;
   case TSTRING:
      ffgcfs(var->fptr, var->colnum, fRow, 1L, nRows,
             (char **)data, undef, &anynul, &status);
      break;
   case TLOGICAL:
      ffgcfl(var->fptr, var->colnum, fRow, 1L, nelem,
             (char *)data, undef, &anynul, &status);
      break;
   case TLONG:
      ffgcfj(var->fptr, var->colnum, fRow, 1L, nelem,
             (long *)data, undef, &anynul, &status);
      break;
   case TDOUBLE:
      ffgcfd(var->fptr, var->colnum, fRow, 1L, nelem,
             (double *)data, undef, &anynul, &status);
      break;
   default:
      snprintf(msg,80,"load_column: unexpected datatype %d", var->datatype);
      ffpmsg(msg);
   }
  }
   if( status ) {
      lParse->status = status;
      return pERROR;
   }

   return 0;
}